

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<bool>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<bool>_>::operator=
          (ExceptionOr<kj::Promise<bool>_> *this,ExceptionOr<kj::Promise<bool>_> *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<kj::Promise<bool>_>::operator=(&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;